

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O3

bool __thiscall
crnlib::qdxt5::create_selector_clusters
          (qdxt5 *this,uint max_selector_clusters,
          vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices)

{
  vec16F_clusterizer *this_00;
  weighted_vec *pwVar1;
  dxt5_block *pdVar2;
  weighted_vec *pwVar3;
  void *pvVar4;
  uint *puVar5;
  byte bVar6;
  bool bVar7;
  undefined1 auVar8 [8];
  bool bVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  undefined8 *puVar13;
  bool bVar14;
  uint uVar15;
  ulong uVar16;
  elemental_vector *peVar17;
  int iVar18;
  weighted_vec_array *pwVar19;
  int iVar20;
  ulong uVar21;
  float *pfVar22;
  uint y;
  int iVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  vector<unsigned_int> *pvVar27;
  float fVar28;
  vector<unsigned_int> selector_vec_remap [2];
  weighted_selector_vec_array selector_vecs [2];
  vec16F sv;
  elemental_vector *local_e0;
  undefined8 uStack_c8;
  qdxt5 *local_c0;
  elemental_vector local_b8;
  elemental_vector local_a8;
  weighted_vec_array local_98;
  weighted_vec_array local_88;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_88.m_p = (weighted_vec *)0x0;
  local_88.m_size = 0;
  local_88.m_capacity = 0;
  local_98.m_p = (weighted_vec *)0x0;
  local_98.m_size = 0;
  local_98.m_capacity = 0;
  local_a8.m_p = (void *)0x0;
  local_a8.m_size = 0;
  local_a8.m_capacity = 0;
  local_b8.m_p = (void *)0x0;
  local_b8.m_size = 0;
  local_b8.m_capacity = 0;
  uVar11 = this->m_num_blocks;
  pwVar19 = &local_98;
  local_e0 = &local_b8;
  bVar7 = false;
  uVar15 = uVar11;
  uStack_c8._4_4_ = max_selector_clusters;
  local_c0 = this;
  bVar9 = true;
  do {
    bVar14 = bVar9;
    if (uVar15 == 0) {
      uVar15 = 0;
    }
    else {
      uVar26 = 0;
      do {
        pdVar2 = this->m_pDst_elements;
        uVar15 = this->m_elements_per_block * uVar26;
        if (bVar7 == pdVar2[uVar15].m_endpoints[0] <= pdVar2[uVar15].m_endpoints[1]) {
          pdVar2 = pdVar2 + uVar15;
          iVar12 = 0;
          uVar21 = 0;
          pfVar22 = (float *)local_78;
          bVar9 = false;
          iVar23 = 0;
          do {
            iVar20 = (int)uVar21;
            iVar18 = 0;
            do {
              uVar11 = (uint)pdVar2->m_selectors[uVar21 >> 3];
              if ((uint)(iVar12 + iVar18) < 0xe) {
                uVar11 = (uint)CONCAT11(pdVar2->m_selectors[(uVar21 >> 3) + 1],
                                        pdVar2->m_selectors[uVar21 >> 3]);
              }
              uVar11 = uVar11 >> ((byte)uVar21 & 7) & 7;
              puVar13 = &g_dxt5_to_linear;
              if ((pdVar2->m_endpoints[1] < pdVar2->m_endpoints[0]) ||
                 (puVar13 = &g_dxt5_alpha6_to_linear, uVar11 < 6)) {
                fVar28 = (float)*(byte *)((long)puVar13 + (ulong)uVar11);
              }
              else {
                bVar9 = true;
                fVar28 = 0.0;
              }
              *pfVar22 = fVar28;
              pfVar22 = pfVar22 + 1;
              iVar18 = iVar18 + 1;
              uVar21 = (ulong)((int)uVar21 + 3);
            } while (iVar18 != 4);
            iVar23 = iVar23 + 1;
            uVar21 = (ulong)(iVar20 + 0xc);
            iVar12 = iVar12 + 4;
          } while (iVar23 != 4);
          if (!bVar9) {
            iVar12 = (uint)pdVar2->m_endpoints[0] - (uint)pdVar2->m_endpoints[1];
            uVar11 = iVar12 * iVar12;
            uVar24 = uVar11 >> 3;
            if (0x7ff < uVar24) {
              uVar24 = 0x800;
            }
            if (uVar11 < 8) {
              uVar24 = 1;
            }
            uVar21 = (ulong)pwVar19->m_size;
            uVar11 = pwVar19->m_size + 1;
            if ((uVar21 != 0xffffffff) && (pwVar19->m_capacity < uVar11)) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)pwVar19,uVar11,true,0x44,
                         vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                         ::object_mover,false);
            }
            pwVar19->m_size = uVar11;
            pwVar3 = pwVar19->m_p;
            pfVar22 = pwVar3[uVar21].m_vec.m_s + 0xc;
            *(undefined8 *)pfVar22 = local_48;
            *(undefined8 *)(pfVar22 + 2) = uStack_40;
            pfVar22 = pwVar3[uVar21].m_vec.m_s + 8;
            *(undefined8 *)pfVar22 = local_58;
            *(undefined8 *)(pfVar22 + 2) = uStack_50;
            pfVar22 = pwVar3[uVar21].m_vec.m_s + 4;
            *(undefined8 *)pfVar22 = local_68;
            *(undefined8 *)(pfVar22 + 2) = uStack_60;
            pwVar1 = pwVar3 + uVar21;
            (pwVar1->m_vec).m_s[0] = (float)local_78._0_4_;
            (pwVar1->m_vec).m_s[1] = (float)local_78._4_4_;
            (pwVar1->m_vec).m_s[2] = (float)uStack_70;
            (pwVar1->m_vec).m_s[3] = uStack_70._4_4_;
            pwVar3[uVar21].m_weight = uVar24;
            uVar11 = local_e0->m_size;
            if (local_e0->m_capacity <= uVar11) {
              elemental_vector::increase_capacity
                        (local_e0,uVar11 + 1,true,4,(object_mover)0x0,false);
              uVar11 = local_e0->m_size;
            }
            *(uint *)((long)local_e0->m_p + (ulong)uVar11 * 4) = uVar26;
            local_e0->m_size = local_e0->m_size + 1;
          }
          uVar11 = local_c0->m_num_blocks;
          this = local_c0;
        }
        uVar26 = uVar26 + 1;
        uVar15 = uVar11;
      } while (uVar26 < uVar11);
    }
    bVar7 = true;
    local_e0 = &local_a8;
    pwVar19 = &local_88;
    bVar9 = false;
  } while (bVar14);
  pvVar27 = selector_cluster_indices->m_p;
  if (pvVar27 != (vector<unsigned_int> *)0x0) {
    uVar11 = selector_cluster_indices->m_size;
    if ((ulong)uVar11 != 0) {
      lVar25 = 0;
      do {
        pvVar4 = *(void **)((long)&pvVar27->m_p + lVar25);
        if (pvVar4 != (void *)0x0) {
          crnlib_free(pvVar4);
        }
        lVar25 = lVar25 + 0x10;
      } while ((ulong)uVar11 << 4 != lVar25);
      pvVar27 = selector_cluster_indices->m_p;
    }
    crnlib_free(pvVar27);
    selector_cluster_indices->m_p = (vector<unsigned_int> *)0x0;
    selector_cluster_indices->m_size = 0;
    selector_cluster_indices->m_capacity = 0;
  }
  uVar21 = (ulong)uStack_c8._4_4_;
  this_00 = &this->m_selector_clusterizer;
  pwVar19 = &local_98;
  peVar17 = &local_b8;
  bVar7 = true;
  do {
    while( true ) {
      uVar10 = (ulong)pwVar19->m_size;
      if (uVar10 != 0) break;
LAB_0014ccaa:
      peVar17 = &local_a8;
      pwVar19 = &local_88;
      bVar9 = bVar7 == false;
      bVar7 = false;
      if (bVar9) {
        bVar9 = true;
        goto LAB_0014ce3a;
      }
    }
    uVar11 = this->m_num_blocks;
    if ((float)uVar10 / (float)uVar11 < 0.01) goto LAB_0014ccaa;
    uVar11 = (uint)(((ulong)(uVar11 - 1) + uVar10 * uVar21) / (ulong)uVar11);
    if (uVar11 < 0x41) {
      uVar11 = 0x40;
    }
    if (pwVar19->m_size <= uVar11) goto LAB_0014ccaa;
    local_78 = (undefined1  [8])0x0;
    uStack_70 = 0;
    uVar24 = this->m_progress_range + 0x10;
    if (bVar7) {
      uVar24 = this->m_progress_range;
    }
    this->m_progress_start = uVar24;
    this->m_progress_range = bVar7 ^ 0x11;
    bVar9 = threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
                      (this_00,pwVar19,uVar11,(vector<crnlib::vector<unsigned_int>_> *)local_78,
                       generate_codebook_progress_callback,this);
    if ((bVar9) && ((float)uStack_70 != 0.0)) {
      uVar11 = selector_cluster_indices->m_size;
      uVar15 = uVar11 + (int)(float)uStack_70;
      if (uVar15 < uVar11) {
        pvVar27 = selector_cluster_indices->m_p;
        uVar26 = -(int)(float)uStack_70;
        lVar25 = 0;
        do {
          pvVar4 = *(void **)((long)&pvVar27[uVar15].m_p + lVar25);
          if (pvVar4 != (void *)0x0) {
            crnlib_free(pvVar4);
          }
          lVar25 = lVar25 + 0x10;
        } while ((ulong)uVar26 << 4 != lVar25);
      }
      else {
        uVar26 = uVar11;
        if (selector_cluster_indices->m_capacity < uVar15) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)selector_cluster_indices,uVar15,true,0x10,(object_mover)0x0
                     ,false);
          uVar26 = selector_cluster_indices->m_size;
        }
        if (uVar15 - uVar26 != 0) {
          memset(selector_cluster_indices->m_p + uVar26,0,(ulong)(uVar15 - uVar26) << 4);
        }
      }
      selector_cluster_indices->m_size = uVar15;
      this = local_c0;
      if ((float)uStack_70 != 0.0) {
        uVar10 = 0;
        do {
          uVar15 = uVar11 + (int)uVar10;
          pvVar27 = selector_cluster_indices->m_p;
          puVar5 = pvVar27[uVar15].m_p;
          pvVar27[uVar15].m_p = ((vector<unsigned_int> *)((long)local_78 + uVar10 * 0x10))->m_p;
          ((vector<unsigned_int> *)((long)local_78 + uVar10 * 0x10))->m_p = puVar5;
          uVar24 = pvVar27[uVar15].m_size;
          pvVar27[uVar15].m_size =
               ((vector<unsigned_int> *)((long)local_78 + uVar10 * 0x10))->m_size;
          ((vector<unsigned_int> *)((long)local_78 + uVar10 * 0x10))->m_size = uVar24;
          uVar24 = pvVar27[uVar15].m_capacity;
          pvVar27[uVar15].m_capacity =
               ((vector<unsigned_int> *)((long)local_78 + uVar10 * 0x10))->m_capacity;
          ((vector<unsigned_int> *)((long)local_78 + uVar10 * 0x10))->m_capacity = uVar24;
          if (pvVar27[uVar15].m_size != 0) {
            uVar16 = 0;
            do {
              puVar5 = pvVar27[uVar15].m_p;
              puVar5[uVar16] = *(uint *)((long)peVar17->m_p + (ulong)puVar5[uVar16] * 4);
              uVar16 = uVar16 + 1;
            } while (uVar16 < pvVar27[uVar15].m_size);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (uStack_70 & 0xffffffff));
      }
    }
    auVar8 = local_78;
    if (local_78 != (undefined1  [8])0x0) {
      uVar10 = uStack_70 & 0xffffffff;
      if (uVar10 != 0) {
        lVar25 = 0;
        do {
          pvVar4 = *(void **)((long)(uint **)auVar8 + lVar25);
          if (pvVar4 != (void *)0x0) {
            crnlib_free(pvVar4);
          }
          lVar25 = lVar25 + 0x10;
        } while (uVar10 << 4 != lVar25);
      }
      crnlib_free((void *)local_78);
    }
    peVar17 = &local_a8;
    pwVar19 = &local_88;
    bVar6 = bVar9 & bVar7;
    bVar7 = false;
  } while (bVar6 != 0);
LAB_0014ce3a:
  lVar25 = 0x20;
  do {
    if (*(void **)((long)&uStack_c8 + lVar25) != (void *)0x0) {
      crnlib_free(*(void **)((long)&uStack_c8 + lVar25));
    }
    lVar25 = lVar25 + -0x10;
  } while (lVar25 != 0);
  lVar25 = 0x20;
  do {
    pvVar4 = *(void **)((long)&local_a8.m_p + lVar25);
    if (pvVar4 != (void *)0x0) {
      crnlib_free(pvVar4);
    }
    lVar25 = lVar25 + -0x10;
  } while (lVar25 != 0);
  return bVar9;
}

Assistant:

bool qdxt5::create_selector_clusters(uint max_selector_clusters, crnlib::vector<crnlib::vector<uint> >& selector_cluster_indices) {
  weighted_selector_vec_array selector_vecs[2];
  crnlib::vector<uint> selector_vec_remap[2];

  for (uint block_type = 0; block_type < 2; block_type++) {
    for (uint block_iter = 0; block_iter < m_num_blocks; block_iter++) {
      dxt5_block& dxt5_block = get_block(block_iter);
      if ((uint)dxt5_block.is_alpha6_block() != block_type)
        continue;

      vec16F sv;
      float* pDst = &sv[0];

      bool uses_absolute_values = false;

      for (uint y = 0; y < 4; y++) {
        for (uint x = 0; x < 4; x++) {
          const uint s = dxt5_block.get_selector(x, y);

          float f;
          if (dxt5_block.is_alpha6_block()) {
            if (s >= 6) {
              uses_absolute_values = true;
              f = 0.0f;
            } else
              f = g_dxt5_alpha6_to_linear[s];
          } else
            f = g_dxt5_to_linear[s];

          *pDst++ = f;
        }
      }

      if (uses_absolute_values)
        continue;

      int low_alpha = dxt5_block.get_low_alpha();
      int high_alpha = dxt5_block.get_high_alpha();
      int dist = math::square(low_alpha - high_alpha);

      const uint cAlphaDistToWeight = 8;
      const uint cMaxWeight = 2048;
      uint weight = math::clamp<uint>(dist / cAlphaDistToWeight, 1, cMaxWeight);

      selector_vecs[block_type].resize(selector_vecs[block_type].size() + 1);
      selector_vecs[block_type].back().m_vec = sv;
      selector_vecs[block_type].back().m_weight = weight;

      selector_vec_remap[block_type].push_back(block_iter);
    }
  }

  selector_cluster_indices.clear();

  for (uint block_type = 0; block_type < 2; block_type++) {
    if (selector_vecs[block_type].empty())
      continue;

    if ((selector_vecs[block_type].size() / (float)m_num_blocks) < .01f)
      continue;
    uint max_clusters = static_cast<uint>((math::emulu(selector_vecs[block_type].size(), max_selector_clusters) + (m_num_blocks - 1)) / m_num_blocks);
    max_clusters = math::minimum(math::maximum(64U, max_clusters), selector_vecs[block_type].size());
    if (max_clusters >= selector_vecs[block_type].size())
      continue;

#if QDXT5_DEBUGGING
    trace("max_clusters (%u): %u\n", block_type, max_clusters);
#endif

    crnlib::vector<crnlib::vector<uint> > block_type_selector_cluster_indices;

    if (!block_type) {
      m_progress_start = m_progress_range;
      m_progress_range = 16;
    } else {
      m_progress_start = m_progress_range + 16;
      m_progress_range = 17;
    }

    if (!m_selector_clusterizer.create_clusters(
            selector_vecs[block_type], max_clusters, block_type_selector_cluster_indices, generate_codebook_progress_callback, this)) {
      return false;
    }

    const uint first_cluster = selector_cluster_indices.size();
    selector_cluster_indices.enlarge(block_type_selector_cluster_indices.size());

    for (uint i = 0; i < block_type_selector_cluster_indices.size(); i++) {
      crnlib::vector<uint>& indices = selector_cluster_indices[first_cluster + i];
      indices.swap(block_type_selector_cluster_indices[i]);

      for (uint j = 0; j < indices.size(); j++)
        indices.at(j) = selector_vec_remap[block_type][indices.at(j)];
    }
  }

  return true;
}